

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O2

void xc_lda_exc_vxc_fxc(xc_func_type *p,size_t np,double *rho,double *zk,double *vrho,double *v2rho2
                       )

{
  xc_lda_out_params local_28;
  
  local_28.v3rho3 = (double *)0x0;
  local_28.v4rho4 = (double *)0x0;
  local_28.zk = zk;
  local_28.vrho = vrho;
  local_28.v2rho2 = v2rho2;
  xc_lda_new(p,2,np,rho,&local_28);
  return;
}

Assistant:

void
xc_lda_exc_vxc_fxc(const xc_func_type *p, size_t np, const double *rho, double *zk, double *vrho, double *v2rho2)
{
  xc_lda_out_params out;
  libxc_memset(&out, 0, sizeof(xc_lda_out_params));
  out.zk     = zk;
  out.vrho   = vrho;
  out.v2rho2 = v2rho2;

  xc_lda_new(p, 2, np, rho, &out);
}